

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall
FileTokenizer::createToken(FileTokenizer *this,TokenType type,size_t length,int64_t value)

{
  size_t sVar1;
  string sStack_48;
  
  (this->token).type = type;
  sVar1 = this->linePos;
  (this->token).line = this->lineNumber;
  (this->token).column = sVar1 + 1;
  std::__cxx11::string::substr((ulong)&sStack_48,(ulong)&this->currentLine);
  Token::setValue<long>(&this->token,value,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  this->linePos = this->linePos + length;
  return;
}

Assistant:

void FileTokenizer::createToken(TokenType type, size_t length, int64_t value)
{
	token.type = type;
	token.line = lineNumber;
	token.column = linePos+1;
	token.setValue(value, currentLine.substr(linePos, length));

	linePos += length;
}